

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++:36:13)>
::getImpl(SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
          *this,ExceptionOrValue *output)

{
  word *__dest;
  FlatArrayMessageReader *count;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  local_460;
  undefined1 local_458 [16];
  Own<capnp::MessageReader,_std::nullptr_t> reader;
  Array<capnp::word> words;
  Own<capnp::FlatArrayMessageReader,_std::nullptr_t> local_408;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e0 [24];
  Disposer *local_3c8;
  ulong local_3c0;
  ArrayPtr<capnp::word> local_3a8;
  ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> local_398;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_398,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_398.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_398);
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::~ExceptionOr(&local_398);
  }
  else if (depResult.value.ptr.isSet == true) {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
               (local_3e0 + 0x10),&depResult.value.ptr.field_1.value);
    if (local_3e0._16_4_ == 2) {
      reader.disposer = (Disposer *)0x0;
      reader.ptr = (MessageReader *)0x0;
      count = (FlatArrayMessageReader *)(local_3c0 >> 3);
      if (((ulong)local_3c8 & 7) == 0) {
        local_3e0._0_8_ = local_3c8;
        local_3e0._8_8_ = count;
        heap<capnp::FlatArrayMessageReader,kj::ArrayPtr<capnp::word>,capnp::ReaderOptions_const&>
                  ((kj *)local_458,(ArrayPtr<capnp::word> *)local_3e0,&(this->func).options);
        Own<capnp::FlatArrayMessageReader,decltype(nullptr)>::attach<kj::Array<unsigned_char>>
                  ((Own<capnp::FlatArrayMessageReader,decltype(nullptr)> *)&local_408,
                   (Array<unsigned_char> *)local_458);
        words.ptr = (word *)local_408.disposer;
        words.size_ = (size_t)local_408.ptr;
        local_408.ptr = (FlatArrayMessageReader *)0x0;
        Own<capnp::MessageReader,_std::nullptr_t>::operator=
                  (&reader,(Own<capnp::MessageReader,_std::nullptr_t> *)&words);
        Own<capnp::MessageReader,_std::nullptr_t>::dispose
                  ((Own<capnp::MessageReader,_std::nullptr_t> *)&words);
        Own<capnp::FlatArrayMessageReader,_std::nullptr_t>::dispose(&local_408);
        Own<capnp::FlatArrayMessageReader,_std::nullptr_t>::dispose
                  ((Own<capnp::FlatArrayMessageReader,_std::nullptr_t> *)local_458);
      }
      else {
        __dest = HeapArrayDisposer::allocate<capnp::word>((size_t)count);
        words.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
        words.ptr = __dest;
        words.size_ = (size_t)count;
        memcpy(__dest,local_3c8,local_3c0 & 0xfffffffffffffff8);
        local_3a8.ptr = __dest;
        local_3a8.size_ = (size_t)count;
        heap<capnp::FlatArrayMessageReader,kj::ArrayPtr<capnp::word>,capnp::ReaderOptions_const&>
                  ((kj *)local_3e0,&local_3a8,&(this->func).options);
        Own<capnp::FlatArrayMessageReader,decltype(nullptr)>::attach<kj::Array<capnp::word>>
                  ((Own<capnp::FlatArrayMessageReader,decltype(nullptr)> *)local_458,
                   (Array<capnp::word> *)local_3e0);
        local_408.disposer = (Disposer *)local_458._0_8_;
        local_408.ptr = (FlatArrayMessageReader *)local_458._8_8_;
        local_458._8_8_ = (FlatArrayMessageReader *)0x0;
        Own<capnp::MessageReader,_std::nullptr_t>::operator=
                  (&reader,(Own<capnp::MessageReader,_std::nullptr_t> *)&local_408);
        Own<capnp::MessageReader,_std::nullptr_t>::dispose
                  ((Own<capnp::MessageReader,_std::nullptr_t> *)&local_408);
        Own<capnp::FlatArrayMessageReader,_std::nullptr_t>::dispose
                  ((Own<capnp::FlatArrayMessageReader,_std::nullptr_t> *)local_458);
        Own<capnp::FlatArrayMessageReader,_std::nullptr_t>::dispose
                  ((Own<capnp::FlatArrayMessageReader,_std::nullptr_t> *)local_3e0);
        Array<capnp::word>::~Array(&words);
      }
      words.disposer = (ArrayDisposer *)reader.ptr;
      reader.ptr = (MessageReader *)0x0;
      local_408.disposer = reader.disposer;
      local_3f8 = 0;
      uStack_3f0 = 0;
      words.ptr = (word *)CONCAT71(words.ptr._1_7_,1);
      words.size_ = (size_t)reader.disposer;
      local_408.ptr = (FlatArrayMessageReader *)0x0;
      Promise<kj::Maybe<capnp::MessageReaderAndFds>_>::Promise
                (&local_460.value,(FixVoid<kj::Maybe<capnp::MessageReaderAndFds>_> *)&words);
      NullableValue<capnp::MessageReaderAndFds>::~NullableValue
                ((NullableValue<capnp::MessageReaderAndFds> *)&words);
      Own<capnp::MessageReader,_std::nullptr_t>::dispose
                ((Own<capnp::MessageReader,_std::nullptr_t> *)&local_408);
      Own<capnp::MessageReader,_std::nullptr_t>::dispose(&reader);
    }
    else {
      if (local_3e0._16_4_ != 3) {
        if (local_3e0._16_4_ == 1) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                    ((Fault *)&words,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++"
                     ,0x2b,FAILED,(char *)0x0,
                     "\"Unexpected websocket text message; expected only binary messages.\"",
                     (char (*) [66])
                     "Unexpected websocket text message; expected only binary messages.");
          Debug::Fault::fatal((Fault *)&words);
        }
        unreachable();
      }
      words.ptr = (word *)((ulong)words.ptr & 0xffffffffffffff00);
      Promise<kj::Maybe<capnp::MessageReaderAndFds>_>::Promise
                (&local_460.value,(FixVoid<kj::Maybe<capnp::MessageReaderAndFds>_> *)&words);
      NullableValue<capnp::MessageReaderAndFds>::~NullableValue
                ((NullableValue<capnp::MessageReaderAndFds> *)&words);
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
               (local_3e0 + 0x10));
    local_398.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_398.value.ptr.isSet = true;
    local_398.value.ptr.field_1 = local_460;
    local_460 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
                 )0x0;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_398);
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::~ExceptionOr(&local_398);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_460.value);
  }
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~ExceptionOr
            (&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }